

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_bool jp2_read_jp2h_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                         opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  uint unaff_EBX;
  opj_bool oVar6;
  uint unaff_R14D;
  OPJ_UINT32 l_value;
  uint local_50;
  uint local_4c;
  opj_jp2_v2_t *local_48;
  OPJ_UINT32 local_3c;
  opj_event_mgr_t *local_38;
  
  if ((jp2->jp2_state & 2) == 0) {
    pcVar5 = "The  box must be the first box in the file.\n";
LAB_001f6f5d:
    oVar6 = 0;
    opj_event_msg_v2(p_manager,1,pcVar5);
  }
  else {
    jp2->jp2_img_state = 0;
    local_48 = jp2;
    if (p_header_size != 0) {
      local_50 = 0;
      local_38 = p_manager;
      do {
        p_manager = local_38;
        if (p_header_size < 8) {
          pcVar5 = "Cannot handle box of less than 8 bytes\n";
LAB_001f7059:
          opj_event_msg_v2(p_manager,1,pcVar5);
          bVar2 = true;
        }
        else {
          opj_read_bytes_LE(p_header_data,&local_4c,4);
          unaff_EBX = local_4c;
          opj_read_bytes_LE(p_header_data + 4,&local_4c,4);
          unaff_R14D = local_4c;
          local_50 = 8;
          if (unaff_EBX == 0) {
            pcVar5 = "Cannot handle box of undefined sizes\n";
            goto LAB_001f7059;
          }
          if (unaff_EBX == 1) {
            local_50 = 8;
            if (p_header_size < 0x10) {
              pcVar5 = "Cannot handle XL box of less than 16 bytes\n";
            }
            else {
              opj_read_bytes_LE(p_header_data + 8,&local_3c,4);
              local_50 = 0xc;
              pcVar5 = "Cannot handle box sizes higher than 2^32\n";
              if (local_3c == 0) {
                opj_read_bytes_LE(p_header_data + 0xc,&local_4c,4);
                unaff_EBX = local_4c;
                if (local_4c != 0) {
                  local_50 = 0x10;
                  goto LAB_001f70fc;
                }
                local_50 = 0x10;
                pcVar5 = "Cannot handle box of undefined sizes\n";
              }
            }
            goto LAB_001f7059;
          }
LAB_001f70fc:
          bVar2 = false;
        }
        if (bVar2) {
          pcVar5 = "Stream error while reading JP2 Header box\n";
          goto LAB_001f6f5d;
        }
        if (p_header_size < unaff_EBX) {
          pcVar5 = "Stream error while reading JP2 Header box: box length is inconsistent.\n";
          goto LAB_001f6f5d;
        }
        lVar4 = 0;
        do {
          if (*(uint *)((long)&jp2_img_header[0].id + lVar4) == unaff_R14D) {
            lVar4 = (long)&jp2_img_header[0].id + lVar4;
            goto LAB_001f708b;
          }
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x60);
        lVar4 = 0;
LAB_001f708b:
        if (lVar4 == 0) {
          pbVar1 = (byte *)((long)&local_48->jp2_img_state + 3);
          *pbVar1 = *pbVar1 | 0x80;
        }
        else {
          iVar3 = (**(code **)(lVar4 + 8))
                            (local_48,p_header_data + local_50,unaff_EBX - local_50,local_38);
          if (iVar3 == 0) {
            return 0;
          }
        }
        p_header_data = p_header_data + local_50 + (unaff_EBX - local_50);
        p_header_size = p_header_size - unaff_EBX;
      } while (p_header_size != 0);
    }
    *(byte *)&local_48->jp2_state = (byte)local_48->jp2_state | 4;
    oVar6 = 1;
  }
  return oVar6;
}

Assistant:

opj_bool jp2_read_jp2h_v2(
						opj_jp2_v2_t *jp2,
						unsigned char * p_header_data,
						unsigned int p_header_size,
						opj_event_mgr_t * p_manager
					)
{
	OPJ_UINT32 l_box_size=0, l_current_data_size = 0;
	opj_jp2_box_t box;
	const opj_jp2_header_handler_t * l_current_handler;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	/* make sure the box is well placed */
	if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The  box must be the first box in the file.\n");
		return OPJ_FALSE;
	}

	jp2->jp2_img_state = JP2_IMG_STATE_NONE;

	/* iterate while remaining data */
	while (p_header_size > 0) {

		if (! jp2_read_boxhdr_char(&box,p_header_data,&l_box_size,p_header_size, p_manager)) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box\n");
			return OPJ_FALSE;
		}

		if (box.length > p_header_size) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box: box length is inconsistent.\n");
			return OPJ_FALSE;
		}

		l_current_handler = jp2_img_find_handler(box.type);
		l_current_data_size = box.length - l_box_size;
		p_header_data += l_box_size;

		if (l_current_handler != 00) {
			if (! l_current_handler->handler(jp2,p_header_data,l_current_data_size,p_manager)) {
				return OPJ_FALSE;
			}
		}
		else {
			jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
		}

		p_header_data += l_current_data_size;
		p_header_size -= box.length;
	}

	jp2->jp2_state |= JP2_STATE_HEADER;

	return OPJ_TRUE;
}